

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_libapi.cpp
# Opt level: O0

ze_result_t
zeDeviceGetP2PProperties
          (ze_device_handle_t hDevice,ze_device_handle_t hPeerDevice,
          ze_device_p2p_properties_t *pP2PProperties)

{
  ze_pfnDeviceGetP2PProperties_t p_Var1;
  __pointer_type p_Var2;
  ze_pfnDeviceGetP2PProperties_t pfnGetP2PProperties;
  ze_device_p2p_properties_t *pP2PProperties_local;
  ze_device_handle_t hPeerDevice_local;
  ze_device_handle_t hDevice_local;
  
  if ((ze_lib::destruction & 1) == 0) {
    p_Var2 = std::atomic<_ze_dditable_t_*>::load
                       ((atomic<_ze_dditable_t_*> *)(ze_lib::context + 0x10),memory_order_seq_cst);
    p_Var1 = (p_Var2->Device).pfnGetP2PProperties;
    if (p_Var1 == (ze_pfnDeviceGetP2PProperties_t)0x0) {
      if ((*(byte *)(ze_lib::context + 0xd90) & 1) == 0) {
        hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
      }
      else {
        hDevice_local._4_4_ = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
      }
    }
    else {
      hDevice_local._4_4_ = (*p_Var1)(hDevice,hPeerDevice,pP2PProperties);
    }
  }
  else {
    hDevice_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  return hDevice_local._4_4_;
}

Assistant:

ze_result_t ZE_APICALL
zeDeviceGetP2PProperties(
    ze_device_handle_t hDevice,                     ///< [in] handle of the device performing the access
    ze_device_handle_t hPeerDevice,                 ///< [in] handle of the peer device with the allocation
    ze_device_p2p_properties_t* pP2PProperties      ///< [in,out] Peer-to-Peer properties between source and peer device
    )
{
    #ifdef DYNAMIC_LOAD_LOADER
    ze_result_t result = ZE_RESULT_SUCCESS;
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }
    static const ze_pfnDeviceGetP2PProperties_t pfnGetP2PProperties = [&result] {
        auto pfnGetP2PProperties = ze_lib::context->zeDdiTable.load()->Device.pfnGetP2PProperties;
        if( nullptr == pfnGetP2PProperties ) {
            result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
        }
        return pfnGetP2PProperties;
    }();
    if (result != ZE_RESULT_SUCCESS) {
        return result;
    }
    return pfnGetP2PProperties( hDevice, hPeerDevice, pP2PProperties );
    #else
    if(ze_lib::destruction) {
        return ZE_RESULT_ERROR_UNINITIALIZED;
    }

    auto pfnGetP2PProperties = ze_lib::context->zeDdiTable.load()->Device.pfnGetP2PProperties;
    if( nullptr == pfnGetP2PProperties ) {
        if(!ze_lib::context->isInitialized)
            return ZE_RESULT_ERROR_UNINITIALIZED;
        else
            return ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
    }

    return pfnGetP2PProperties( hDevice, hPeerDevice, pP2PProperties );
    #endif
}